

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void transform(uint32_t *state,uint32_t *data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint local_7c;
  uint uStack_78;
  uint j;
  uint32_t T [8];
  uint32_t W [16];
  uint32_t *data_local;
  uint32_t *state_local;
  
  _uStack_78 = *(undefined8 *)state;
  T._0_8_ = *(undefined8 *)(state + 2);
  T._8_8_ = *(undefined8 *)(state + 4);
  T._16_8_ = *(undefined8 *)(state + 6);
  for (local_7c = 0; local_7c < 0x40; local_7c = local_7c + 0x10) {
    if (local_7c == 0) {
      T[6] = *data;
    }
    else {
      T[6] = ((W[0xc] >> 0x11 | W[0xc] << 0xf) ^ (W[0xc] >> 0x13 | W[0xc] << 0xd) ^ W[0xc] >> 10) +
             W[7] + ((T[7] >> 7 | T[7] << 0x19) ^ (T[7] >> 0x12 | T[7] << 0xe) ^ T[7] >> 3) + T[6];
    }
    iVar1 = ((T[2] >> 6 | T[2] << 0x1a) ^ (T[2] >> 0xb | T[2] << 0x15) ^ (T[2] >> 0x19 | T[2] << 7))
            + (T[4] ^ T[2] & (T[3] ^ T[4])) + SHA256_K[local_7c] + T[6] + T[5];
    uVar2 = iVar1 + T[1];
    uVar3 = ((uStack_78 >> 2 | uStack_78 << 0x1e) ^ (uStack_78 >> 0xd | uStack_78 << 0x13) ^
            (uStack_78 >> 0x16 | uStack_78 << 10)) + (uStack_78 & j | T[0] & (uStack_78 | j)) +
            iVar1;
    if (local_7c == 0) {
      T[7] = data[1];
    }
    else {
      T[7] = ((W[0xd] >> 0x11 | W[0xd] << 0xf) ^ (W[0xd] >> 0x13 | W[0xd] << 0xd) ^ W[0xd] >> 10) +
             W[8] + ((W[0] >> 7 | W[0] << 0x19) ^ (W[0] >> 0x12 | W[0] << 0xe) ^ W[0] >> 3) + T[7];
    }
    iVar1 = ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
            (uVar2 >> 0x19 | uVar2 * 0x80)) + (T[3] ^ uVar2 & (T[2] ^ T[3])) +
            SHA256_K[local_7c + 1] + T[7] + T[4];
    uVar4 = iVar1 + T[0];
    uVar5 = ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
            (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uStack_78 | j & (uVar3 | uStack_78)) + iVar1
    ;
    if (local_7c == 0) {
      W[0] = data[2];
    }
    else {
      W[0] = ((T[6] >> 0x11 | T[6] << 0xf) ^ (T[6] >> 0x13 | T[6] << 0xd) ^ T[6] >> 10) + W[9] +
             ((W[1] >> 7 | W[1] << 0x19) ^ (W[1] >> 0x12 | W[1] << 0xe) ^ W[1] >> 3) + W[0];
    }
    iVar1 = ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
            (uVar4 >> 0x19 | uVar4 * 0x80)) + (T[2] ^ uVar4 & (uVar2 ^ T[2])) +
            SHA256_K[local_7c + 2] + W[0] + T[3];
    uVar6 = iVar1 + j;
    uVar7 = ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
            (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uStack_78 & (uVar5 | uVar3)) + iVar1
    ;
    if (local_7c == 0) {
      W[1] = data[3];
    }
    else {
      W[1] = ((T[7] >> 0x11 | T[7] << 0xf) ^ (T[7] >> 0x13 | T[7] << 0xd) ^ T[7] >> 10) + W[10] +
             ((W[2] >> 7 | W[2] << 0x19) ^ (W[2] >> 0x12 | W[2] << 0xe) ^ W[2] >> 3) + W[1];
    }
    iVar1 = ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
            (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) +
            SHA256_K[local_7c + 3] + W[1] + T[2];
    uStack_78 = iVar1 + uStack_78;
    uVar8 = ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
            (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5)) + iVar1;
    if (local_7c == 0) {
      W[2] = data[4];
    }
    else {
      W[2] = ((W[0] >> 0x11 | W[0] << 0xf) ^ (W[0] >> 0x13 | W[0] << 0xd) ^ W[0] >> 10) + W[0xb] +
             ((W[3] >> 7 | W[3] << 0x19) ^ (W[3] >> 0x12 | W[3] << 0xe) ^ W[3] >> 3) + W[2];
    }
    iVar1 = ((uStack_78 >> 6 | uStack_78 * 0x4000000) ^ (uStack_78 >> 0xb | uStack_78 * 0x200000) ^
            (uStack_78 >> 0x19 | uStack_78 * 0x80)) + (uVar4 ^ uStack_78 & (uVar6 ^ uVar4)) +
            SHA256_K[local_7c + 4] + W[2] + uVar2;
    uVar3 = iVar1 + uVar3;
    uVar2 = ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
            (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar7 | uVar5 & (uVar8 | uVar7)) + iVar1;
    if (local_7c == 0) {
      W[3] = data[5];
    }
    else {
      W[3] = ((W[1] >> 0x11 | W[1] << 0xf) ^ (W[1] >> 0x13 | W[1] << 0xd) ^ W[1] >> 10) + W[0xc] +
             ((W[4] >> 7 | W[4] << 0x19) ^ (W[4] >> 0x12 | W[4] << 0xe) ^ W[4] >> 3) + W[3];
    }
    iVar1 = ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
            (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uStack_78 ^ uVar6)) +
            SHA256_K[local_7c + 5] + W[3] + uVar4;
    uVar5 = iVar1 + uVar5;
    uVar4 = ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
            (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar8 | uVar7 & (uVar2 | uVar8)) + iVar1;
    if (local_7c == 0) {
      W[4] = data[6];
    }
    else {
      W[4] = ((W[2] >> 0x11 | W[2] << 0xf) ^ (W[2] >> 0x13 | W[2] << 0xd) ^ W[2] >> 10) + W[0xd] +
             ((W[5] >> 7 | W[5] << 0x19) ^ (W[5] >> 0x12 | W[5] << 0xe) ^ W[5] >> 3) + W[4];
    }
    iVar1 = ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
            (uVar5 >> 0x19 | uVar5 * 0x80)) + (uStack_78 ^ uVar5 & (uVar3 ^ uStack_78)) +
            SHA256_K[local_7c + 6] + W[4] + uVar6;
    uVar7 = iVar1 + uVar7;
    uVar6 = ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
            (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar8 & (uVar4 | uVar2)) + iVar1;
    if (local_7c == 0) {
      W[5] = data[7];
    }
    else {
      W[5] = ((W[3] >> 0x11 | W[3] << 0xf) ^ (W[3] >> 0x13 | W[3] << 0xd) ^ W[3] >> 10) + T[6] +
             ((W[6] >> 7 | W[6] << 0x19) ^ (W[6] >> 0x12 | W[6] << 0xe) ^ W[6] >> 3) + W[5];
    }
    iVar1 = ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
            (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) +
            SHA256_K[local_7c + 7] + W[5] + uStack_78;
    uVar8 = iVar1 + uVar8;
    uVar9 = ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
            (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4)) + iVar1;
    if (local_7c == 0) {
      W[6] = data[8];
    }
    else {
      W[6] = ((W[4] >> 0x11 | W[4] << 0xf) ^ (W[4] >> 0x13 | W[4] << 0xd) ^ W[4] >> 10) + T[7] +
             ((W[7] >> 7 | W[7] << 0x19) ^ (W[7] >> 0x12 | W[7] << 0xe) ^ W[7] >> 3) + W[6];
    }
    iVar1 = ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
            (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar5 ^ uVar8 & (uVar7 ^ uVar5)) +
            SHA256_K[local_7c + 8] + W[6] + uVar3;
    uVar2 = iVar1 + uVar2;
    uVar3 = ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
            (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar4 & (uVar9 | uVar6)) + iVar1;
    if (local_7c == 0) {
      W[7] = data[9];
    }
    else {
      W[7] = ((W[5] >> 0x11 | W[5] << 0xf) ^ (W[5] >> 0x13 | W[5] << 0xd) ^ W[5] >> 10) + W[0] +
             ((W[8] >> 7 | W[8] << 0x19) ^ (W[8] >> 0x12 | W[8] << 0xe) ^ W[8] >> 3) + W[7];
    }
    iVar1 = ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
            (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar8 ^ uVar7)) +
            SHA256_K[local_7c + 9] + W[7] + uVar5;
    uVar4 = iVar1 + uVar4;
    uVar5 = ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
            (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar9 | uVar6 & (uVar3 | uVar9)) + iVar1;
    if (local_7c == 0) {
      W[8] = data[10];
    }
    else {
      W[8] = ((W[6] >> 0x11 | W[6] << 0xf) ^ (W[6] >> 0x13 | W[6] << 0xd) ^ W[6] >> 10) + W[1] +
             ((W[9] >> 7 | W[9] << 0x19) ^ (W[9] >> 0x12 | W[9] << 0xe) ^ W[9] >> 3) + W[8];
    }
    iVar1 = ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
            (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar8 ^ uVar4 & (uVar2 ^ uVar8)) +
            SHA256_K[local_7c + 10] + W[8] + uVar7;
    uVar6 = iVar1 + uVar6;
    uVar7 = ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
            (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar9 & (uVar5 | uVar3)) + iVar1;
    if (local_7c == 0) {
      W[9] = data[0xb];
    }
    else {
      W[9] = ((W[7] >> 0x11 | W[7] << 0xf) ^ (W[7] >> 0x13 | W[7] << 0xd) ^ W[7] >> 10) + W[2] +
             ((W[10] >> 7 | W[10] << 0x19) ^ (W[10] >> 0x12 | W[10] << 0xe) ^ W[10] >> 3) + W[9];
    }
    iVar1 = ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
            (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) +
            SHA256_K[local_7c + 0xb] + W[9] + uVar8;
    uVar9 = iVar1 + uVar9;
    uVar8 = ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
            (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5)) + iVar1;
    if (local_7c == 0) {
      W[10] = data[0xc];
    }
    else {
      W[10] = ((W[8] >> 0x11 | W[8] << 0xf) ^ (W[8] >> 0x13 | W[8] << 0xd) ^ W[8] >> 10) + W[3] +
              ((W[0xb] >> 7 | W[0xb] << 0x19) ^ (W[0xb] >> 0x12 | W[0xb] << 0xe) ^ W[0xb] >> 3) +
              W[10];
    }
    iVar1 = ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
            (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar4 ^ uVar9 & (uVar6 ^ uVar4)) +
            SHA256_K[local_7c + 0xc] + W[10] + uVar2;
    T[5] = iVar1 + uVar3;
    T[1] = ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
           (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar7 | uVar5 & (uVar8 | uVar7)) + iVar1;
    if (local_7c == 0) {
      W[0xb] = data[0xd];
    }
    else {
      W[0xb] = ((W[9] >> 0x11 | W[9] << 0xf) ^ (W[9] >> 0x13 | W[9] << 0xd) ^ W[9] >> 10) + W[4] +
               ((W[0xc] >> 7 | W[0xc] << 0x19) ^ (W[0xc] >> 0x12 | W[0xc] << 0xe) ^ W[0xc] >> 3) +
               W[0xb];
    }
    iVar1 = ((T[5] >> 6 | T[5] * 0x4000000) ^ (T[5] >> 0xb | T[5] * 0x200000) ^
            (T[5] >> 0x19 | T[5] * 0x80)) + (uVar6 ^ T[5] & (uVar9 ^ uVar6)) +
            SHA256_K[local_7c + 0xd] + W[0xb] + uVar4;
    T[4] = iVar1 + uVar5;
    T[0] = ((T[1] >> 2 | T[1] * 0x40000000) ^ (T[1] >> 0xd | T[1] * 0x80000) ^
           (T[1] >> 0x16 | T[1] * 0x400)) + (T[1] & uVar8 | uVar7 & (T[1] | uVar8)) + iVar1;
    if (local_7c == 0) {
      W[0xc] = data[0xe];
    }
    else {
      W[0xc] = ((W[10] >> 0x11 | W[10] << 0xf) ^ (W[10] >> 0x13 | W[10] << 0xd) ^ W[10] >> 10) +
               W[5] + ((W[0xd] >> 7 | W[0xd] << 0x19) ^ (W[0xd] >> 0x12 | W[0xd] << 0xe) ^
                      W[0xd] >> 3) + W[0xc];
    }
    iVar1 = ((T[4] >> 6 | T[4] * 0x4000000) ^ (T[4] >> 0xb | T[4] * 0x200000) ^
            (T[4] >> 0x19 | T[4] * 0x80)) + (uVar9 ^ T[4] & (T[5] ^ uVar9)) +
            SHA256_K[local_7c + 0xe] + W[0xc] + uVar6;
    T[3] = iVar1 + uVar7;
    uVar2 = ((T[0] >> 2 | T[0] * 0x40000000) ^ (T[0] >> 0xd | T[0] * 0x80000) ^
            (T[0] >> 0x16 | T[0] * 0x400)) + (T[0] & T[1] | uVar8 & (T[0] | T[1])) + iVar1;
    if (local_7c == 0) {
      W[0xd] = data[0xf];
    }
    else {
      W[0xd] = ((W[0xb] >> 0x11 | W[0xb] << 0xf) ^ (W[0xb] >> 0x13 | W[0xb] << 0xd) ^ W[0xb] >> 10)
               + W[6] + ((T[6] >> 7 | T[6] << 0x19) ^ (T[6] >> 0x12 | T[6] << 0xe) ^ T[6] >> 3) +
               W[0xd];
    }
    iVar1 = ((T[3] >> 6 | T[3] * 0x4000000) ^ (T[3] >> 0xb | T[3] * 0x200000) ^
            (T[3] >> 0x19 | T[3] * 0x80)) + (T[5] ^ T[3] & (T[4] ^ T[5])) + SHA256_K[local_7c + 0xf]
            + W[0xd] + uVar9;
    T[2] = iVar1 + uVar8;
    _uStack_78 = CONCAT44(uVar2,((uVar2 >> 2 | uVar2 * 0x40000000) ^
                                 (uVar2 >> 0xd | uVar2 * 0x80000) ^ (uVar2 >> 0x16 | uVar2 * 0x400))
                                + (uVar2 & T[0] | T[1] & (uVar2 | T[0])) + iVar1);
  }
  *state = uStack_78 + *state;
  state[1] = j + state[1];
  state[2] = T[0] + state[2];
  state[3] = T[1] + state[3];
  state[4] = T[2] + state[4];
  state[5] = T[3] + state[5];
  state[6] = T[4] + state[6];
  state[7] = T[5] + state[7];
  return;
}

Assistant:

static void
transform(uint32_t state[], const uint32_t data[])
{
	uint32_t W[16];
	uint32_t T[8];
	unsigned int j;

	// Copy state[] to working vars.
	memcpy(T, state, sizeof(T));

	// 64 operations, partially loop unrolled
	for (j = 0; j < 64; j += 16) {
		R( 0); R( 1); R( 2); R( 3);
		R( 4); R( 5); R( 6); R( 7);
		R( 8); R( 9); R(10); R(11);
		R(12); R(13); R(14); R(15);
	}

	// Add the working vars back into state[].
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
}